

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_terminate(void)

{
  Integer handle;
  Integer i;
  long local_8;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (GAinitialized != 0) {
    sai_terminate_sparse_arrays();
    for (local_8 = 0; local_8 < _max_global_array; local_8 = local_8 + 1) {
      if (GA[local_8].actv != 0) {
        pnga_destroy(handle);
      }
      if (GA[local_8].ptr != (char **)0x0) {
        free(GA[local_8].ptr);
      }
      if (GA[local_8].mapc != (C_Integer *)0x0) {
        free(GA[local_8].mapc);
      }
    }
    for (local_8 = 0; local_8 < _max_global_array; local_8 = local_8 + 1) {
      if (PGRP_LIST[local_8].actv != 0) {
        free(PGRP_LIST[local_8].map_proc_list);
      }
    }
    pnga_sync();
    GA_total_memory = -1;
    GA_memory_limited = 0;
    gai_finalize_onesided();
    free(mapALL);
    free(_ga_main_data_structure);
    free(_proc_list_main_data_structure);
    ARMCI_Free((void *)0x130f85);
    free(GA_Update_Flags);
    ARMCI_Free_local((void *)0x130fa3);
    pnga_sync();
    ARMCI_Finalize();
    MPI_Comm_free(&GA_MPI_World_comm_dup);
    ARMCIinitialized = 0;
    GAinitialized = 0;
  }
  return;
}

Assistant:

void pnga_terminate() 
{
    //GA_Internal_Threadsafe_Lock();
Integer i, handle;

    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(!GAinitialized)
    {
        //GA_Internal_Threadsafe_Unlock();
        return;
    }

    sai_terminate_sparse_arrays();
#ifdef PROFILE_OLD 
    ga_profile_terminate();
#endif
    for (i=0;i<_max_global_array;i++){
          handle = i - GA_OFFSET ;
          if(GA[i].actv) pnga_destroy(handle);
          if(GA[i].ptr) free(GA[i].ptr);
          if(GA[i].mapc) free(GA[i].mapc);
    }
    /* don't free groups list until all arrays destroyed */
    for (i=0;i<_max_global_array;i++){
          if(PGRP_LIST[i].actv) free(PGRP_LIST[i].map_proc_list);
    }
    pnga_sync();

    GA_total_memory = -1; /* restore "unlimited" memory usage status */
    GA_memory_limited = 0;
    gai_finalize_onesided();
    free(mapALL);
    free(_ga_main_data_structure);
    free(_proc_list_main_data_structure);
    ARMCI_Free(GA_Update_Flags[GAme]);
    free(GA_Update_Flags);
    ARMCI_Free_local(GA_Update_Signal);

    pnga_sync();
    ARMCI_Finalize();
#ifdef MSG_COMMS_MPI
    MPI_Comm_free(&GA_MPI_World_comm_dup);
#endif
    ARMCIinitialized = 0;
    GAinitialized = 0;
    //GA_Internal_Threadsafe_Unlock();
}